

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dShape.h
# Opt level: O3

void __thiscall btBox2dShape::setMargin(btBox2dShape *this,btScalar collisionMargin)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float extraout_XMM0_Da_03;
  float extraout_XMM0_Da_04;
  
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])();
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  fVar1 = (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
          m_implicitShapeDimensions.m_floats[2];
  (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.m_collisionMargin =
       collisionMargin;
  uVar2 = *(undefined8 *)
           (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
           m_implicitShapeDimensions.m_floats;
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])(this);
  auVar3._4_4_ = (extraout_XMM0_Da_00 + (float)((ulong)uVar2 >> 0x20)) - extraout_XMM0_Da_03;
  auVar3._0_4_ = (extraout_XMM0_Da + (float)uVar2) - extraout_XMM0_Da_02;
  auVar3._8_4_ = (extraout_XMM0_Da_01 + fVar1) - extraout_XMM0_Da_04;
  auVar3._12_4_ = 0;
  *(undefined1 (*) [16])
   (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.m_implicitShapeDimensions.
   m_floats = auVar3;
  return;
}

Assistant:

virtual void setMargin(btScalar collisionMargin)
	{
		//correct the m_implicitShapeDimensions for the margin
		btVector3 oldMargin(getMargin(),getMargin(),getMargin());
		btVector3 implicitShapeDimensionsWithMargin = m_implicitShapeDimensions+oldMargin;
		
		btConvexInternalShape::setMargin(collisionMargin);
		btVector3 newMargin(getMargin(),getMargin(),getMargin());
		m_implicitShapeDimensions = implicitShapeDimensionsWithMargin - newMargin;

	}